

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O0

ostream * Kernel::operator<<(ostream *out,Inference *self)

{
  byte bVar1;
  type_conflict3 tVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  ulong *in_RSI;
  ostream *in_RDI;
  InferenceRule in_stack_000005df;
  string local_30 [32];
  ulong *local_10;
  ostream *local_8;
  
  bVar1 = (byte)*in_RSI & 3;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (bVar1 == 0) {
    std::operator<<(in_RDI,"INFERENCE_012, (");
  }
  else if (bVar1 == 1) {
    std::operator<<(in_RDI,"INFERENCE_MANY, (");
  }
  else if (bVar1 == 2) {
    std::operator<<(in_RDI,"INFERENCE_FROM_SAT_REFUTATION, (");
  }
  poVar5 = local_8;
  ruleName_abi_cxx11_(in_stack_000005df);
  std::operator<<(poVar5,local_30);
  std::__cxx11::string::~string(local_30);
  poVar5 = std::operator<<(local_8,"), it: ");
  tVar2 = toNumber((UnitInputType)(*local_10 >> 2) & (MODEL_DEFINITION|ASSUMPTION));
  std::operator<<(poVar5,tVar2);
  poVar5 = std::operator<<(local_8,", incl: ");
  std::ostream::operator<<(poVar5,(bool)((byte)(*local_10 >> 0x10) & 1));
  poVar5 = std::operator<<(local_8,", ptd: ");
  std::ostream::operator<<(poVar5,(bool)((byte)(*local_10 >> 0x11) & 1));
  bVar3 = Shell::Options::addCombAxioms(Lib::env);
  if (bVar3) {
    poVar5 = std::operator<<(local_8,", cad: ");
    std::ostream::operator<<(poVar5,(uint)(*local_10 >> 0x12) & 1);
  }
  bVar3 = Shell::Options::addProxyAxioms(Lib::env);
  if (bVar3) {
    poVar5 = std::operator<<(local_8,", pad: ");
    std::ostream::operator<<(poVar5,(uint)(*local_10 >> 0x13) & 1);
  }
  bVar3 = Shell::Options::addCombAxioms(Lib::env);
  if ((bVar3) && (bVar3 = Shell::Options::addProxyAxioms(Lib::env), bVar3)) {
    poVar5 = std::operator<<(local_8,", had: ");
    std::ostream::operator<<(poVar5,(uint)(*local_10 >> 0x14) & 1);
  }
  poVar5 = std::operator<<(local_8,", id: ");
  std::ostream::operator<<(poVar5,(uint)(*local_10 >> 0x15) & 0x1f);
  iVar4 = Shell::Options::maxXXNarrows(Lib::env);
  if (0 < iVar4) {
    poVar5 = std::operator<<(local_8,", xxNarrs ");
    std::ostream::operator<<(poVar5,(uint)(*local_10 >> 0x28) & 7);
  }
  bVar3 = Shell::Options::prioritiseClausesProducedByLongReduction(Lib::env);
  if (bVar3) {
    poVar5 = std::operator<<(local_8,", redLen ");
    std::ostream::operator<<(poVar5,(uint)local_10[1] & 0x3fffffff);
  }
  poVar5 = std::operator<<(local_8,", sl: ");
  std::operator<<(poVar5,(uchar)(*local_10 >> 0x20));
  poVar5 = std::operator<<(local_8,", age: ");
  std::ostream::operator<<(poVar5,*(uint *)((long)local_10 + 0xc));
  poVar5 = std::operator<<(local_8,", thAx:");
  std::ostream::operator<<(poVar5,(int)*(float *)(local_10 + 5));
  poVar5 = std::operator<<(local_8,", allAx:");
  std::ostream::operator<<(poVar5,(int)*(float *)((long)local_10 + 0x2c));
  return local_8;
}

Assistant:

std::ostream& Kernel::operator<<(std::ostream& out, Inference const& self)
{
  switch(self._kind) {
    case Inference::Kind::INFERENCE_012:
      out << "INFERENCE_012, (";
      break;
    case Inference::Kind::INFERENCE_MANY:
      out << "INFERENCE_MANY, (";
      break;
    case Inference::Kind::INFERENCE_FROM_SAT_REFUTATION:
      out << "INFERENCE_FROM_SAT_REFUTATION, (";
      break;
  }
  // TODO get rid of intermediate string generation by ruleName
  out << ruleName(self._rule);
  out << "), it: " << toNumber(self._inputType);

  out << ", incl: " << self._included;
  out << ", ptd: " << self._isPureTheoryDescendant;
  if(env.options->addCombAxioms()){
    out << ", cad: " << self._combAxiomsDescendant;
  }
  if(env.options->addProxyAxioms()){
     out << ", pad: " << self._proxyAxiomsDescendant;
  }
  if(env.options->addCombAxioms() && env.options->addProxyAxioms()){
    out << ", had: " << self._holAxiomsDescendant;
  }
  out << ", id: " << self._inductionDepth;
  if(env.options->maxXXNarrows() > 0){
    out << ", xxNarrs " << self._XXNarrows;
  }
  if(env.options->prioritiseClausesProducedByLongReduction()){
    out << ", redLen " << self._reductions;
  }
  out << ", sl: " << self._sineLevel;
  out << ", age: " << self._age;
  out << ", thAx:" << (int)(self.th_ancestors);
  out << ", allAx:" << (int)(self.all_ancestors);

  return out;
}